

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void explainAppendTerm(StrAccum *pStr,Index *pIdx,int nTerm,int iTerm,int bAnd,char *zOp)

{
  short sVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  
  if (bAnd != 0) {
    uVar2 = pStr->nChar;
    if (uVar2 + 5 < pStr->nAlloc) {
      pStr->nChar = uVar2 + 5;
      pcVar6 = pStr->zText;
      pcVar6[(ulong)uVar2 + 4] = ' ';
      builtin_strncpy(pcVar6 + uVar2," AND",4);
    }
    else {
      enlargeAndAppend(pStr," AND ",5);
    }
  }
  if (nTerm < 2) {
    if (nTerm == 1) goto LAB_00191b01;
    bVar3 = false;
  }
  else {
    uVar2 = pStr->nChar;
    uVar4 = uVar2 + 1;
    if (uVar4 < pStr->nAlloc) {
      pStr->nChar = uVar4;
      pStr->zText[uVar2] = '(';
    }
    else {
      enlargeAndAppend(pStr,"(",1);
    }
LAB_00191b01:
    uVar7 = 0;
    do {
      if (uVar7 != 0) {
        uVar2 = pStr->nChar;
        uVar4 = uVar2 + 1;
        if (uVar4 < pStr->nAlloc) {
          pStr->nChar = uVar4;
          pStr->zText[uVar2] = ',';
        }
        else {
          enlargeAndAppend(pStr,",",1);
        }
      }
      sVar1 = pIdx->aiColumn[(long)iTerm + uVar7];
      pcVar6 = "<expr>";
      if (sVar1 != -2) {
        if (sVar1 == -1) {
          pcVar6 = "rowid";
        }
        else {
          pcVar6 = pIdx->pTable->aCol[sVar1].zName;
        }
      }
      sqlite3_str_appendall(pStr,pcVar6);
      uVar7 = uVar7 + 1;
    } while ((uint)nTerm != uVar7);
    bVar3 = true;
    if (1 < nTerm) {
      uVar2 = pStr->nChar;
      uVar4 = uVar2 + 1;
      if (uVar4 < pStr->nAlloc) {
        pStr->nChar = uVar4;
        pStr->zText[uVar2] = ')';
      }
      else {
        enlargeAndAppend(pStr,")",1);
      }
      uVar2 = pStr->nChar;
      uVar4 = uVar2 + 1;
      if (uVar4 < pStr->nAlloc) {
        pStr->nChar = uVar4;
        pStr->zText[uVar2] = *zOp;
      }
      else {
        enlargeAndAppend(pStr,zOp,1);
      }
      uVar2 = pStr->nChar;
      uVar4 = uVar2 + 1;
      if (uVar4 < pStr->nAlloc) {
        pStr->nChar = uVar4;
        pStr->zText[uVar2] = '(';
      }
      else {
        enlargeAndAppend(pStr,"(",1);
      }
      goto LAB_00191c64;
    }
  }
  uVar2 = pStr->nChar;
  uVar4 = uVar2 + 1;
  if (uVar4 < pStr->nAlloc) {
    pStr->nChar = uVar4;
    pStr->zText[uVar2] = *zOp;
  }
  else {
    enlargeAndAppend(pStr,zOp,1);
  }
  if (!bVar3) {
    return;
  }
LAB_00191c64:
  iVar5 = 0;
  do {
    if (iVar5 != 0) {
      uVar2 = pStr->nChar;
      uVar4 = uVar2 + 1;
      if (uVar4 < pStr->nAlloc) {
        pStr->nChar = uVar4;
        pStr->zText[uVar2] = ',';
      }
      else {
        enlargeAndAppend(pStr,",",1);
      }
    }
    uVar2 = pStr->nChar;
    uVar4 = uVar2 + 1;
    if (uVar4 < pStr->nAlloc) {
      pStr->nChar = uVar4;
      pStr->zText[uVar2] = '?';
    }
    else {
      enlargeAndAppend(pStr,"?",1);
    }
    iVar5 = iVar5 + 1;
  } while (nTerm != iVar5);
  if (1 < nTerm) {
    uVar2 = pStr->nChar;
    uVar4 = uVar2 + 1;
    if (pStr->nAlloc <= uVar4) {
      enlargeAndAppend(pStr,")",1);
      return;
    }
    pStr->nChar = uVar4;
    pStr->zText[uVar2] = ')';
  }
  return;
}

Assistant:

static void explainAppendTerm(
  StrAccum *pStr,             /* The text expression being built */
  Index *pIdx,                /* Index to read column names from */
  int nTerm,                  /* Number of terms */
  int iTerm,                  /* Zero-based index of first term. */
  int bAnd,                   /* Non-zero to append " AND " */
  const char *zOp             /* Name of the operator */
){
  int i;

  assert( nTerm>=1 );
  if( bAnd ) sqlite3_str_append(pStr, " AND ", 5);

  if( nTerm>1 ) sqlite3_str_append(pStr, "(", 1);
  for(i=0; i<nTerm; i++){
    if( i ) sqlite3_str_append(pStr, ",", 1);
    sqlite3_str_appendall(pStr, explainIndexColumnName(pIdx, iTerm+i));
  }
  if( nTerm>1 ) sqlite3_str_append(pStr, ")", 1);

  sqlite3_str_append(pStr, zOp, 1);

  if( nTerm>1 ) sqlite3_str_append(pStr, "(", 1);
  for(i=0; i<nTerm; i++){
    if( i ) sqlite3_str_append(pStr, ",", 1);
    sqlite3_str_append(pStr, "?", 1);
  }
  if( nTerm>1 ) sqlite3_str_append(pStr, ")", 1);
}